

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O1

void __thiscall t_json_generator::end_object(t_json_generator *this)

{
  int *piVar1;
  ostream *poVar2;
  string local_38;
  
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->f_json_,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_38,&this->super_t_generator);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  std::deque<bool,_std::allocator<bool>_>::pop_back(&(this->comma_needed_).c);
  return;
}

Assistant:

void t_json_generator::end_object() {
  indent_down();
  f_json_ << endl << indent() << "}";
  comma_needed_.pop();
}